

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void * tp_worker(void *args)

{
  pthread_mutex_t *__mutex;
  qdata_t task;
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  void *extraout_RAX;
  void *pvVar4;
  __pthread_unwind_buf_t *__buf;
  thread_pool_t *tp;
  long lVar5;
  undefined1 local_138 [8];
  __pthread_unwind_buf_t __cancel_buf;
  undefined1 local_c8 [8];
  __pthread_unwind_buf_t __cancel_buf_1;
  undefined8 local_50;
  void *local_48;
  qdata_t local_38;
  
  iVar2 = __sigsetjmp(local_138);
  __buf = (__pthread_unwind_buf_t *)local_138;
  if (iVar2 == 0) {
    __pthread_register_cancel(__buf);
    __mutex = (pthread_mutex_t *)((long)args + 0x28);
    local_38.i64 = 0;
    pthread_mutex_lock(__mutex);
    iVar2 = __sigsetjmp(local_c8);
    if (iVar2 == 0) {
      __cancel_buf_1.__pad[3] = (void *)((long)args + 0x80);
      do {
        __pthread_register_cancel((__pthread_unwind_buf_t *)local_c8);
        while (uVar3 = queue_len((queue_t *)((long)args + 0x10)), uVar3 == 0) {
          pthread_cond_wait((pthread_cond_t *)((long)args + 0x50),__mutex);
        }
        _Var1 = queue_dequeue((queue_t *)((long)args + 0x10),&local_38);
        task = local_38;
        __pthread_unregister_cancel((__pthread_unwind_buf_t *)local_c8);
        pthread_mutex_unlock(__mutex);
        if ((task.i64 != 0 && _Var1) && (*task.ptr != (code *)0x0)) {
          if (*(cleanup_t *)(task.i64 + 8) == (cleanup_t)0x0) {
            (**task.ptr)(*(void **)(task.i64 + 0x10));
          }
          else {
            local_50 = *(cleanup_t *)(task.i64 + 8);
            local_48 = *(void **)(task.i64 + 0x10);
            iVar2 = __sigsetjmp((__pthread_unwind_buf_t *)local_c8);
            if (iVar2 != 0) goto LAB_00102913;
            __pthread_register_cancel((__pthread_unwind_buf_t *)local_c8);
            (**task.ptr)(*(void **)(task.i64 + 0x10));
            __pthread_unregister_cancel((__pthread_unwind_buf_t *)local_c8);
            (**(cleanup_t *)(task.i64 + 8))(*(void **)(task.i64 + 0x10));
          }
          LOCK();
          *(int *)__cancel_buf_1.__pad[3] = *__cancel_buf_1.__pad[3] + -1;
          UNLOCK();
          if (*__cancel_buf_1.__pad[3] == 0) {
            pthread_cond_signal((pthread_cond_t *)((long)args + 0x88));
          }
          tp_task_free((tp_task_t *)task.ptr);
        }
        local_38.i64 = 0;
        pthread_mutex_lock(__mutex);
        iVar2 = __sigsetjmp(local_c8);
      } while (iVar2 == 0);
    }
    tp_cleanup_unlock(args);
    __buf = (__pthread_unwind_buf_t *)local_c8;
  }
  __pthread_unwind_next(__buf);
LAB_00102913:
  (*(code *)local_50)(local_48);
  tp = (thread_pool_t *)local_c8;
  __pthread_unwind_next((__pthread_unwind_buf_t *)tp);
  if (tp == (thread_pool_t *)0x0) {
    return extraout_RAX;
  }
  if (tp->threads != (pthread_t *)0x0) {
    if (0 < (int)tp->nthread) {
      lVar5 = 0;
      do {
        iVar2 = pthread_cancel(tp->threads[lVar5]);
        if (iVar2 != 0) {
          perror("pthread_cancel() failed");
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)tp->nthread);
    }
    tp_join(tp);
    free(tp->threads);
  }
  iVar2 = pthread_cond_destroy((pthread_cond_t *)&tp->has_task);
  if (iVar2 != 0) {
    perror("pthread_cond_destroy() failed");
  }
  iVar2 = pthread_mutex_destroy((pthread_mutex_t *)&tp->lock);
  if (iVar2 != 0) {
    perror("pthread_mutex_destroy()");
  }
  if (g_self_key_inited == '\x01') {
    tp_tls_destroy(&g_self_tls);
    g_self_key_inited = '\0';
  }
  queue_clear(&tp->task_queue);
  pvVar4 = memset(tp,0,0xb8);
  return pvVar4;
}

Assistant:

void *tp_worker(void *args)
{
    qdata_t data;
    thread_pool_t *pool = args;
    tp_task_t *task = NULL;

    pthread_cleanup_push(tp_cleanup, pool) ;

            while (1) {
                data.ptr = NULL;
                task = NULL;

                // Take a task
                pthread_mutex_lock(&pool->lock);

                pthread_cleanup_push(tp_cleanup_unlock, pool) ;
                        // If no task in queue, wait until someone post one.
                        while (queue_isempty(&pool->task_queue)) {
                            pthread_cond_wait(&pool->has_task, &pool->lock);
                        }
                        // Dequeue a task for running
                        if (queue_dequeue(&pool->task_queue, &data)) {
                            task = data.ptr;
                        }

                pthread_cleanup_pop(0);

                pthread_mutex_unlock(&pool->lock);

                // Run a task
                if (task && task->runner) {
                    if (task->cleanup) {
                        pthread_cleanup_push(task->cleanup, task->args) ;
                                task->runner(task->args);
                        pthread_cleanup_pop(0);
                        task->cleanup(task->args);
                    } else {
                        task->runner(task->args);
                    }


                    // Note: pool->task_queue is empty DO NOT means there is no task
                    //
                    // If there is no task remain in the queue after dequeue operation,
                    // signal for tp_join_task()
                    if (__sync_sub_and_fetch(&pool->active_tasks, 1) == 0) {
                        pthread_cond_signal(&pool->no_task);
                    }

                    tp_task_free(task);
                    task = NULL;
                }
            }

    pthread_cleanup_pop(0);

    return NULL;
}